

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

void __thiscall
glcts::ViewportArray::Utils::shaderCompilationException::shaderCompilationException
          (shaderCompilationException *this,GLchar *source,GLchar *message)

{
  allocator<char> local_12;
  allocator<char> local_11;
  
  *(undefined ***)this = &PTR__shaderCompilationException_02152ae0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_shader_source,source,&local_11);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_error_message,message,&local_12);
  return;
}

Assistant:

Utils::shaderCompilationException::shaderCompilationException(const glw::GLchar* source, const glw::GLchar* message)
	: m_shader_source(source), m_error_message(message)
{
	/* Nothing to be done */
}